

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::ProcessGetCFHeaders
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  uint256 *puVar1;
  CConnman *this_00;
  string msg_type;
  bool bVar2;
  bool bVar3;
  CBlockIndex *block_index;
  Logger *pLVar4;
  string *args;
  DataStream *__nbytes;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined8 uStack_158;
  Peer *local_150;
  vector<uint256,_std::allocator<uint256>_> filter_hashes;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint32_t local_120;
  BlockFilterType local_119;
  uint256 local_118;
  long *local_f8;
  undefined8 local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  uint256 prev_header;
  uint256 stop_hash;
  long *local_98;
  undefined8 uStack_90;
  long local_88;
  undefined8 uStack_80;
  undefined1 local_70 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __nbytes = vRecv;
  DataStream::read(vRecv,(int)&local_119,(void *)0x1,(size_t)vRecv);
  DataStream::read(vRecv,(int)&local_120,(void *)0x4,(size_t)__nbytes);
  DataStream::read(vRecv,(int)&stop_hash,(void *)0x20,(size_t)__nbytes);
  bVar2 = PrepareBlockFilterRequest
                    (this,node,peer,local_119,local_120,&stop_hash,2000,&stop_index,&filter_index);
  if (!bVar2) goto LAB_00905ff4;
  prev_header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  prev_header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_150 = peer;
  if (local_120 != 0) {
    block_index = CBlockIndex::GetAncestor(stop_index,local_120 - 1);
    bVar2 = BlockFilterIndex::LookupFilterHeader(filter_index,block_index,&prev_header);
    if (!bVar2) {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
      if (bVar3) {
        local_150 = (Peer *)BlockFilterTypeName_abi_cxx11_(local_119);
        puVar1 = block_index->phashBlock;
        if (puVar1 == (uint256 *)0x0) goto LAB_0090601f;
        local_98 = *(long **)(puVar1->super_base_blob<256U>).m_data._M_elems;
        uStack_90 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
        local_88 = *(long *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
        uStack_80 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
        base_blob<256u>::ToString_abi_cxx11_((string *)local_70,&local_98);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x62;
        logging_function._M_str = "ProcessGetCFHeaders";
        logging_function._M_len = 0x13;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0xddc,NET,Debug,(ConstevalFormatString<2U>)0xf9f37d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   (string *)local_70);
        if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
      }
      if (!bVar2) goto LAB_00905ff4;
    }
  }
  filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = BlockFilterIndex::LookupFilterHashRange(filter_index,local_120,stop_index,&filter_hashes);
  if (bVar2) {
    local_f8 = (long *)&local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cfheaders","");
    puVar1 = stop_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_0090601f:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_118.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_118.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
    local_118.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_118.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
    this_00 = this->m_connman;
    if (local_f8 == (long *)&local_e8) {
      uStack_80 = uStack_e0;
      local_98 = &local_88;
    }
    else {
      local_98 = local_f8;
    }
    local_88 = CONCAT71(uStack_e7,local_e8);
    uStack_90 = local_f0;
    local_f0 = 0;
    local_e8 = 0;
    msg_type._M_string_length = (size_type)local_150;
    msg_type._M_dataplus._M_p = (pointer)uStack_158;
    msg_type.field_2._M_allocated_capacity =
         (size_type)
         filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    msg_type.field_2._8_8_ =
         filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f8 = (long *)&local_e8;
    NetMsg::Make<unsigned_char&,uint256,uint256&,std::vector<uint256,std::allocator<uint256>>&>
              ((CSerializedNetMsg *)local_70,(NetMsg *)&local_98,msg_type,&local_119,&local_118,
               &prev_header,&filter_hashes);
    CConnman::PushMessage(this_00,node,(CSerializedNetMsg *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._24_8_ != &local_48) {
      operator_delete((void *)local_70._24_8_,local_48._M_allocated_capacity + 1);
    }
    if ((long *)local_70._0_8_ != (long *)0x0) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_f8 != (long *)&local_e8) {
      local_70._16_8_ = CONCAT71(uStack_e7,local_e8);
      local_70._0_8_ = local_f8;
LAB_00905fd5:
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  else {
    pLVar4 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,NET,Debug);
    if (bVar2) {
      args = BlockFilterTypeName_abi_cxx11_(local_119);
      base_blob<256u>::ToString_abi_cxx11_((string *)local_70,&stop_hash);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      logging_function_00._M_str = "ProcessGetCFHeaders";
      logging_function_00._M_len = 0x13;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_int,std::__cxx11::string>
                (logging_function_00,source_file_00,0xde4,NET,Debug,
                 (ConstevalFormatString<3U>)0xf9f3c9,args,&local_120,(string *)local_70);
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) goto LAB_00905fd5;
    }
  }
  if (filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)filter_hashes.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00905ff4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFHeaders(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint32_t start_height;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> start_height >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, start_height, stop_hash,
                                   MAX_GETCFHEADERS_SIZE, stop_index, filter_index)) {
        return;
    }

    uint256 prev_header;
    if (start_height > 0) {
        const CBlockIndex* const prev_block =
            stop_index->GetAncestor(static_cast<int>(start_height - 1));
        if (!filter_index->LookupFilterHeader(prev_block, prev_header)) {
            LogDebug(BCLog::NET, "Failed to find block filter header in index: filter_type=%s, block_hash=%s\n",
                         BlockFilterTypeName(filter_type), prev_block->GetBlockHash().ToString());
            return;
        }
    }

    std::vector<uint256> filter_hashes;
    if (!filter_index->LookupFilterHashRange(start_height, stop_index, filter_hashes)) {
        LogDebug(BCLog::NET, "Failed to find block filter hashes in index: filter_type=%s, start_height=%d, stop_hash=%s\n",
                     BlockFilterTypeName(filter_type), start_height, stop_hash.ToString());
        return;
    }

    MakeAndPushMessage(node, NetMsgType::CFHEADERS,
              filter_type_ser,
              stop_index->GetBlockHash(),
              prev_header,
              filter_hashes);
}